

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_or_listen_error_after_close(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t tcp;
  undefined1 local_f8 [12];
  undefined8 local_ec;
  undefined4 local_e4;
  uv_tcp_t local_e0;
  
  local_ec = 0;
  local_e4 = 0;
  local_f8._8_4_ = 0xf270002;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&local_e0);
  local_f8._0_8_ = SEXT48(iVar1);
  if ((void *)local_f8._0_8_ == (void *)0x0) {
    uv_close((uv_handle_t *)&local_e0,(uv_close_cb)0x0);
    iVar1 = uv_tcp_bind(&local_e0,(sockaddr *)(local_f8 + 8),0);
    local_f8._0_8_ = SEXT48(iVar1);
    if ((void *)local_f8._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3cd5;
    iVar1 = uv_listen((uv_stream_t *)&local_e0,5,(uv_connection_cb)0x0);
    local_f8._0_8_ = SEXT48(iVar1);
    if ((void *)local_f8._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3ce4;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_f8._0_8_ = SEXT48(iVar1);
    if ((void *)local_f8._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_f8._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)local_f8._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c3d02;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c3cd5:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c3ce4:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c3d02:
  handle = (uv_handle_t *)local_f8;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_or_listen_error_after_close) {
  uv_tcp_t tcp;
  struct sockaddr_in addr;

  memset(&addr, 0, sizeof(addr));
  addr.sin_addr.s_addr = htonl(INADDR_ANY);
  addr.sin_port = htons(9999);
  addr.sin_family = AF_INET;

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  uv_close((uv_handle_t*) &tcp, NULL);
  ASSERT_EQ(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0), UV_EINVAL);
  ASSERT_EQ(uv_listen((uv_stream_t*) &tcp, 5, NULL), UV_EINVAL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}